

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractanimation_p.cpp
# Opt level: O3

int __thiscall QAnimationTimer::qt_metacall(QAnimationTimer *this,Call _c,int _id,void **_a)

{
  uint uVar1;
  
  uVar1 = QObject::qt_metacall((QObject *)this,_c,_id,_a);
  if (-1 < (int)uVar1) {
    if (_c == RegisterMethodArgumentMetaType) {
      if (uVar1 < 2) {
        *(undefined8 *)*_a = 0;
      }
    }
    else {
      if (_c != InvokeMetaMethod) {
        return uVar1;
      }
      if (uVar1 < 2) {
        if (uVar1 == 0) {
          startAnimations(this);
        }
        else {
          stopTimer(this);
        }
      }
    }
    uVar1 = uVar1 - 2;
  }
  return uVar1;
}

Assistant:

int QAnimationTimer::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QAbstractAnimationTimer::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 2)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 2;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 2)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 2;
    }
    return _id;
}